

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuCreate.c
# Opt level: O1

void Fxu_CreateCoversNode
               (Fxu_Matrix *p,Fxu_Data_t *pData,int iNode,Fxu_Cube *pCubeFirst,Fxu_Cube *pCubeNext)

{
  Fxu_Cube **ppFVar1;
  uint uVar2;
  int iVar3;
  Fxu_Var **ppFVar4;
  long lVar5;
  int iVar6;
  uint *puVar7;
  void *pvVar8;
  Fxu_Cube *pFVar9;
  char *pSop;
  Fxu_Lit *pFVar10;
  Fxu_Var *pFVar11;
  byte bVar12;
  int iVar13;
  long lVar14;
  uint uVar15;
  
  p->ppTailVars = &p->pOrderVars;
  p->pOrderVars = (Fxu_Var *)0x0;
  pFVar9 = pCubeFirst;
  if (pCubeFirst != pCubeNext) {
    do {
      for (pFVar10 = (pFVar9->lLits).pHead; pFVar10 != (Fxu_Lit *)0x0; pFVar10 = pFVar10->pHNext) {
        iVar13 = pFVar10->pVar->iVar;
        pFVar11 = p->ppVars[(int)(iVar13 - (iVar13 >> 0x1f) | 1)];
        if (pFVar11->pOrder == (Fxu_Var *)0x0) {
          *p->ppTailVars = pFVar11;
          p->ppTailVars = &pFVar11->pOrder;
          pFVar11->pOrder = (Fxu_Var *)0x1;
        }
      }
      ppFVar1 = &pFVar9->pNext;
      pFVar9 = *ppFVar1;
    } while (*ppFVar1 != pCubeNext);
  }
  puVar7 = (uint *)malloc(0x10);
  puVar7[0] = 0x10;
  puVar7[1] = 0;
  pvVar8 = malloc(0x40);
  *(void **)(puVar7 + 2) = pvVar8;
  pFVar11 = p->pOrderVars;
  if ((Fxu_Var *)0x1 < pFVar11) {
    do {
      iVar13 = pFVar11->iVar;
      uVar2 = *puVar7;
      if (puVar7[1] == uVar2) {
        if ((int)uVar2 < 0x10) {
          if (*(void **)(puVar7 + 2) == (void *)0x0) {
            pvVar8 = malloc(0x40);
          }
          else {
            pvVar8 = realloc(*(void **)(puVar7 + 2),0x40);
          }
          *(void **)(puVar7 + 2) = pvVar8;
          uVar15 = 0x10;
        }
        else {
          uVar15 = uVar2 * 2;
          if ((int)uVar15 <= (int)uVar2) goto LAB_004b2c04;
          if (*(void **)(puVar7 + 2) == (void *)0x0) {
            pvVar8 = malloc((ulong)uVar2 << 3);
          }
          else {
            pvVar8 = realloc(*(void **)(puVar7 + 2),(ulong)uVar2 << 3);
          }
          *(void **)(puVar7 + 2) = pvVar8;
        }
        if (pvVar8 == (void *)0x0) {
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
        *puVar7 = uVar15;
      }
LAB_004b2c04:
      uVar2 = puVar7[1];
      puVar7[1] = uVar2 + 1;
      *(int *)(*(long *)(puVar7 + 2) + (long)(int)uVar2 * 4) = iVar13 / 2;
      pFVar11 = pFVar11->pOrder;
    } while (pFVar11 != (Fxu_Var *)0x1);
  }
  Fxu_MatrixRingVarsUnmark(p);
  qsort(*(void **)(puVar7 + 2),(long)(int)puVar7[1],4,Vec_IntSortCompare1);
  uVar2 = puVar7[1];
  if (0 < (long)(int)uVar2) {
    ppFVar4 = p->ppVars;
    lVar5 = *(long *)(puVar7 + 2);
    lVar14 = 0;
    do {
      (ppFVar4[(long)*(int *)(lVar5 + lVar14 * 4) * 2]->lLits).nItems = (int)lVar14;
      (ppFVar4[(long)*(int *)(lVar5 + lVar14 * 4) * 2 + 1]->lLits).nItems = (int)lVar14;
      lVar14 = lVar14 + 1;
    } while ((int)uVar2 != lVar14);
  }
  iVar13 = 0;
  pFVar9 = pCubeFirst;
  if (pCubeFirst != pCubeNext) {
    do {
      iVar13 = (iVar13 + 1) - (uint)((pFVar9->lLits).nItems == 0);
      ppFVar1 = &pFVar9->pNext;
      pFVar9 = *ppFVar1;
    } while (*ppFVar1 != pCubeNext);
  }
  pSop = Abc_SopStart(pData->pManSop,iVar13,uVar2);
  if ((iNode < pData->nNodesOld) &&
     (iVar13 = Abc_SopGetPhase((char *)pData->vSops->pArray[iNode]), iVar13 == 0)) {
    Abc_SopComplement(pSop);
  }
  iVar13 = 0;
  do {
    if (pCubeFirst == pCubeNext) {
      iVar6 = Abc_SopGetCubeNum(pSop);
      if (iVar13 != iVar6) {
        __assert_fail("nCubes == Abc_SopGetCubeNum(pSopCover)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fxu/fxuCreate.c"
                      ,399,
                      "void Fxu_CreateCoversNode(Fxu_Matrix *, Fxu_Data_t *, int, Fxu_Cube *, Fxu_Cube *)"
                     );
      }
      pData->vSopsNew->pArray[iNode] = pSop;
      pData->vFaninsNew->pArray[iNode] = puVar7;
      return;
    }
    if ((pCubeFirst->lLits).nItems != 0) {
      pFVar10 = (pCubeFirst->lLits).pHead;
      if (pFVar10 != (Fxu_Lit *)0x0) {
        uVar2 = puVar7[1];
        do {
          iVar6 = (pFVar10->pVar->lLits).nItems;
          if ((int)puVar7[1] <= iVar6) {
            __assert_fail("iNum < vInputsNew->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fxu/fxuCreate.c"
                          ,0x186,
                          "void Fxu_CreateCoversNode(Fxu_Matrix *, Fxu_Data_t *, int, Fxu_Cube *, Fxu_Cube *)"
                         );
          }
          iVar3 = pFVar10->pVar->iVar;
          bVar12 = (byte)iVar3 & 1;
          if (iVar3 / 2 < pData->nNodesOld) {
            bVar12 = bVar12 ^ 0x31;
          }
          else {
            bVar12 = bVar12 | 0x30;
          }
          pSop[(long)iVar6 + (long)iVar13 * ((long)(int)uVar2 + 3)] = bVar12;
          pFVar10 = pFVar10->pHNext;
        } while (pFVar10 != (Fxu_Lit *)0x0);
      }
      iVar13 = iVar13 + 1;
    }
    pCubeFirst = pCubeFirst->pNext;
  } while( true );
}

Assistant:

void Fxu_CreateCoversNode( Fxu_Matrix * p, Fxu_Data_t * pData, int iNode, Fxu_Cube * pCubeFirst, Fxu_Cube * pCubeNext )
{
    Vec_Int_t * vInputsNew;
    char * pSopCover, * pSopCube;
    Fxu_Var * pVar;
    Fxu_Cube * pCube;
    Fxu_Lit * pLit;
    int iNum, nCubes, v;

    // collect positive polarity variable in the cubes between pCubeFirst and pCubeNext
    Fxu_MatrixRingVarsStart( p );
    for ( pCube = pCubeFirst; pCube != pCubeNext; pCube = pCube->pNext )
        for ( pLit = pCube->lLits.pHead; pLit; pLit = pLit->pHNext )
        {
            pVar = p->ppVars[ 2 * (pLit->pVar->iVar/2) + 1 ];
            if ( pVar->pOrder == NULL )
                Fxu_MatrixRingVarsAdd( p, pVar );
        }
    Fxu_MatrixRingVarsStop( p );

    // collect the variable numbers
    vInputsNew = Vec_IntAlloc( 4 );
    Fxu_MatrixForEachVarInRing( p, pVar )
        Vec_IntPush( vInputsNew, pVar->iVar / 2 );
    Fxu_MatrixRingVarsUnmark( p );

    // sort the vars by their number
    Vec_IntSort( vInputsNew, 0 );

    // mark the vars with their numbers in the sorted array
    for ( v = 0; v < vInputsNew->nSize; v++ )
    {
        p->ppVars[ 2 * vInputsNew->pArray[v] + 0 ]->lLits.nItems = v; // hack - reuse lLits.nItems
        p->ppVars[ 2 * vInputsNew->pArray[v] + 1 ]->lLits.nItems = v; // hack - reuse lLits.nItems
    }

    // count the number of cubes
    nCubes = 0;
    for ( pCube = pCubeFirst; pCube != pCubeNext; pCube = pCube->pNext )
        if ( pCube->lLits.nItems )
            nCubes++;

    // allocate room for the new cover
    pSopCover = Abc_SopStart( pData->pManSop, nCubes, vInputsNew->nSize );
    // set the correct polarity of the cover
    if ( iNode < pData->nNodesOld && Abc_SopGetPhase( (char *)pData->vSops->pArray[iNode] ) == 0 )
        Abc_SopComplement( pSopCover );

    // add the cubes
    nCubes = 0;
    for ( pCube = pCubeFirst; pCube != pCubeNext; pCube = pCube->pNext )
    {
        if ( pCube->lLits.nItems == 0 )
            continue;
        // get hold of the SOP cube
        pSopCube = pSopCover + nCubes * (vInputsNew->nSize + 3);
        // insert literals
        for ( pLit = pCube->lLits.pHead; pLit; pLit = pLit->pHNext )
        {
            iNum = pLit->pVar->lLits.nItems; // hack - reuse lLits.nItems
            assert( iNum < vInputsNew->nSize );
            if ( pLit->pVar->iVar / 2 < pData->nNodesOld )
                pSopCube[iNum] = (pLit->pVar->iVar & 1)? '0' : '1';   // reverse CST
            else
                pSopCube[iNum] = (pLit->pVar->iVar & 1)? '1' : '0';   // no CST
        }
        // count the cube
        nCubes++;
    }
    assert( nCubes == Abc_SopGetCubeNum(pSopCover) );

    // set the new cover and the array of fanins
    pData->vSopsNew->pArray[iNode]   = pSopCover;
    pData->vFaninsNew->pArray[iNode] = vInputsNew;
}